

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

uint32_t hash_constant(void *c)

{
  Constant *c1;
  void *c_local;
  
  if (*c == 8) {
    c_local._4_4_ = (uint32_t)*(undefined8 *)((long)c + 8);
  }
  else if (*c == 0x10) {
    c_local._4_4_ = (uint32_t)(long)*(double *)((long)c + 8);
  }
  else {
    c_local._4_4_ = *(uint32_t *)(*(long *)((long)c + 8) + 8);
  }
  return c_local._4_4_;
}

Assistant:

static uint32_t hash_constant(const void *c)
{
	const Constant *c1 = (const Constant *)c;
	if (c1->type == RAVI_TNUMINT)
		return (uint32_t)c1->i;
	else if (c1->type == RAVI_TNUMFLT)
		return (uint32_t)c1->n; // FIXME maybe use Lua's hash gen
	else
		return (uint32_t)c1->s->hash;
}